

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

int av1_cyclic_refresh_estimate_bits_at_q(AV1_COMP *cpi,double correction_factor)

{
  int *piVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  AV1_COMP *cpi_00;
  int estimated_bits;
  double weight_segment2;
  double weight_segment1;
  int num4x4bl;
  int mbs;
  CYCLIC_REFRESH *cr;
  int base_qindex;
  AV1_COMMON *cm;
  double in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int q;
  AV1_COMP *in_stack_ffffffffffffffb0;
  double local_40;
  double local_38;
  
  q = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  piVar1 = *(int **)(in_RDI + 0x712a8);
  iVar2 = *(int *)(in_RDI + 0x3c190) << 4;
  local_38 = (double)piVar1[7] / (double)iVar2;
  local_40 = (double)piVar1[8] / (double)iVar2;
  if (*(int *)(in_RDI + 0x60870) != 0) {
    local_38 = (double)((*piVar1 * *(int *)(in_RDI + 0x3c194) * *(int *)(in_RDI + 0x3c198)) / 100) /
               (double)iVar2;
    local_40 = 0.0;
  }
  iVar2 = av1_estimate_bits_at_q(in_stack_ffffffffffffffb0,q,in_stack_ffffffffffffffa0);
  dVar3 = (double)iVar2;
  iVar2 = av1_estimate_bits_at_q(in_stack_ffffffffffffffb0,q,dVar3);
  cpi_00 = (AV1_COMP *)(((1.0 - local_38) - local_40) * dVar3 + local_38 * (double)iVar2);
  iVar2 = av1_estimate_bits_at_q(cpi_00,(int)((ulong)local_40 >> 0x20),dVar3);
  dVar3 = round(local_40 * (double)iVar2 + (double)cpi_00);
  return (int)dVar3;
}

Assistant:

int av1_cyclic_refresh_estimate_bits_at_q(const AV1_COMP *cpi,
                                          double correction_factor) {
  const AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  const CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int mbs = cm->mi_params.MBs;
  const int num4x4bl = mbs << 4;
  // Weight for non-base segments: use actual number of blocks refreshed in
  // previous/just encoded frame. Note number of blocks here is in 4x4 units.
  double weight_segment1 = (double)cr->actual_num_seg1_blocks / num4x4bl;
  double weight_segment2 = (double)cr->actual_num_seg2_blocks / num4x4bl;
  if (cpi->rc.rtc_external_ratectrl) {
    weight_segment1 = (double)(cr->percent_refresh * cm->mi_params.mi_rows *
                               cm->mi_params.mi_cols / 100) /
                      num4x4bl;
    weight_segment2 = 0;
  }
  // Take segment weighted average for estimated bits.
  const int estimated_bits = (int)round(
      (1.0 - weight_segment1 - weight_segment2) *
          av1_estimate_bits_at_q(cpi, base_qindex, correction_factor) +
      weight_segment1 *
          av1_estimate_bits_at_q(cpi, base_qindex + cr->qindex_delta[1],
                                 correction_factor) +
      weight_segment2 *
          av1_estimate_bits_at_q(cpi, base_qindex + cr->qindex_delta[2],
                                 correction_factor));
  return estimated_bits;
}